

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O3

IntrinsicResult MiniScript::intrinsic_char(Context *context,IntrinsicResult partialResult)

{
  int32_t iVar1;
  long *plVar2;
  undefined8 *puVar3;
  size_t __n;
  anon_union_8_3_2f476f46_for_data aVar4;
  _func_int **__dest;
  char buf [5];
  long *local_60;
  char local_58;
  Value local_50;
  undefined1 local_40 [8];
  anon_union_8_3_2f476f46_for_data local_38;
  
  local_58 = '\0';
  plVar2 = (long *)operator_new(0x30);
  plVar2[1] = 1;
  *plVar2 = (long)&PTR__StringStorage_001bf0d8;
  plVar2[3] = 10;
  plVar2[4] = -1;
  puVar3 = (undefined8 *)operator_new__(10);
  plVar2[2] = (long)puVar3;
  *puVar3 = 0x6e696f5065646f63;
  *(undefined2 *)(puVar3 + 1) = 0x74;
  local_60 = plVar2;
  Context::GetVar((Context *)local_40,(String *)partialResult.rs,(LocalOnlyMode)&local_60);
  iVar1 = Value::IntValue((Value *)local_40);
  if ((Temp < local_40[0]) && (local_38.ref != (RefCountedStorage *)0x0)) {
    plVar2 = &(local_38.ref)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(local_38.ref)->_vptr_RefCountedStorage[1])();
    }
    local_38.number = 0.0;
  }
  if ((local_60 != (long *)0x0) && (local_58 == '\0')) {
    plVar2 = local_60 + 1;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (**(code **)(*local_60 + 8))();
    }
    local_60 = (long *)0x0;
  }
  __n = UTF8Encode((long)iVar1,local_40);
  if (__n == 0) {
    aVar4.number = 0.0;
  }
  else {
    aVar4.ref = (RefCountedStorage *)operator_new(0x30);
    (aVar4.ref)->refCount = 1;
    (aVar4.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
    aVar4.ref[1].refCount = __n + 1;
    aVar4.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
    __dest = (_func_int **)operator_new__(__n + 1);
    aVar4.ref[1]._vptr_RefCountedStorage = __dest;
    memset((void *)((long)__dest + __n),0,(ulong)(__n != 0xffffffffffffffff));
    memcpy(__dest,local_40,__n);
    *(undefined1 *)((long)__dest + __n) = 0;
  }
  local_50.type = String;
  local_50.noInvoke = false;
  local_50.localOnly = Off;
  local_50.data = aVar4;
  if (aVar4.ref == (RefCountedStorage *)0x0) {
    local_50.data = DAT_001c1308;
  }
  if (local_50.data.ref != (RefCountedStorage *)0x0) {
    (local_50.data.ref)->refCount = (local_50.data.ref)->refCount + 1;
  }
  (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
  IntrinsicResult::ensureStorage((IntrinsicResult *)context);
  Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                   &local_50);
  *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
  if ((Temp < local_50.type) && (local_50.data.ref != (RefCountedStorage *)0x0)) {
    plVar2 = &(local_50.data.ref)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(local_50.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_50.data.number = 0.0;
  }
  if (aVar4.ref != (RefCountedStorage *)0x0) {
    plVar2 = &(aVar4.ref)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(aVar4.ref)->_vptr_RefCountedStorage[1])(aVar4.number);
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_char(Context *context, IntrinsicResult partialResult) {
		long codePoint = context->GetVar("codePoint").IntValue();
		char buf[5];
		long len = UTF8Encode((unsigned long)codePoint, (unsigned char*)buf);
		String s(buf, (size_t)len);
		return IntrinsicResult(s);
	}